

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void save(LexState *ls,int c)

{
  Mbuffer *pMVar1;
  size_t sVar2;
  char *pcVar3;
  size_t newsize;
  Mbuffer *b;
  int c_local;
  LexState *ls_local;
  
  pMVar1 = ls->buff;
  if (pMVar1->buffsize < pMVar1->n + 1) {
    if (0x3ffffffffffffffe < pMVar1->buffsize) {
      lexerror(ls,"lexical element too long",0);
    }
    sVar2 = pMVar1->buffsize << 1;
    pcVar3 = (char *)luaM_realloc_(ls->L,pMVar1->buffer,pMVar1->buffsize,sVar2);
    pMVar1->buffer = pcVar3;
    pMVar1->buffsize = sVar2;
  }
  sVar2 = pMVar1->n;
  pMVar1->n = sVar2 + 1;
  pMVar1->buffer[sVar2] = (char)c;
  return;
}

Assistant:

static void save (LexState *ls, int c) {
  Mbuffer *b = ls->buff;
  if (luaZ_bufflen(b) + 1 > luaZ_sizebuffer(b)) {
    size_t newsize;
    if (luaZ_sizebuffer(b) >= MAX_SIZE/2)
      lexerror(ls, "lexical element too long", 0);
    newsize = luaZ_sizebuffer(b) * 2;
    luaZ_resizebuffer(ls->L, b, newsize);
  }
  b->buffer[luaZ_bufflen(b)++] = cast(char, c);
}